

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::generateShaders
          (ImageBindingRenderCase *this)

{
  string *name;
  ShaderType SVar1;
  RenderContext *renderCtx;
  DataType DVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  ShaderProgram *this_00;
  ProgramSources *pPVar6;
  uint uVar7;
  DataType dataType;
  ulong uVar8;
  ulong uVar9;
  undefined1 local_540 [40];
  undefined1 local_518 [40];
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string imageType;
  string texCoordType;
  ProgramSources local_3f0;
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  DVar2 = TYPE_INT_VEC3;
  if (this->m_imageType != 0x904e) {
    DVar2 = TYPE_INVALID;
  }
  dataType = TYPE_INT_VEC2;
  if (this->m_imageType != 0x904d) {
    dataType = DVar2;
  }
  pcVar4 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoordType,pcVar4,(allocator<char> *)&local_3f0);
  DVar2 = glu::getDataTypeFromGLType(this->m_imageType);
  pcVar4 = glu::getDataTypeName(DVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imageType,pcVar4,(allocator<char> *)&local_3f0);
  uVar3 = (this->super_LayoutBindingRenderCase).m_numBindings;
  uVar7 = (this->super_LayoutBindingRenderCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar9 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  uVar8 = 1;
  if (1 < uVar7) {
    uVar8 = (ulong)uVar3;
  }
  name = &(this->super_LayoutBindingRenderCase).m_uniformName;
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    poVar5 = std::operator<<((ostream *)&shaderUniformDecl,"layout(rgba8, binding = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(this->super_LayoutBindingRenderCase).m_bindings.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9]);
    poVar5 = std::operator<<(poVar5,") uniform readonly highp ");
    poVar5 = std::operator<<(poVar5,(string *)&imageType);
    poVar5 = std::operator<<(poVar5," ");
    if (uVar7 < 2) {
      getUniformName((string *)&local_3f0,name,(int)uVar9,
                     (this->super_LayoutBindingRenderCase).m_numBindings);
    }
    else {
      getUniformName((string *)&local_3f0,name,(int)uVar9);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_3f0);
    std::operator<<(poVar5,";\n");
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  for (local_540._0_4_ = SHADERTYPE_VERTEX;
      (int)local_540._0_4_ < (this->super_LayoutBindingRenderCase).m_numBindings;
      local_540._0_4_ = local_540._0_4_ + SHADERTYPE_FRAGMENT) {
    poVar5 = std::operator<<((ostream *)&shaderBody,"\t");
    pcVar4 = "else if";
    if (local_540._0_4_ == SHADERTYPE_VERTEX) {
      pcVar4 = "if";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5," (u_arrayNdx == ");
    de::toString<int>((string *)&local_3f0,(int *)local_540);
    poVar5 = std::operator<<(poVar5,(string *)&local_3f0);
    poVar5 = std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(poVar5,"\t{\n");
    poVar5 = std::operator<<(poVar5,"\t\tcolor = imageLoad(");
    if (uVar7 < 2) {
      getUniformName((string *)local_518,name,0,local_540._0_4_);
    }
    else {
      getUniformName((string *)local_518,name,local_540._0_4_);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_518);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,(string *)&texCoordType);
    poVar5 = std::operator<<(poVar5,"(0));\n");
    std::operator<<(poVar5,"\t}\n");
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  poVar5 = std::operator<<((ostream *)&shaderBody,"\telse\n");
  poVar5 = std::operator<<(poVar5,"\t{\n");
  poVar5 = std::operator<<(poVar5,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar5,"\t}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  memset(&local_3f0,0,0xac);
  local_3f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_3f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_3f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_3f0._193_8_ = 0;
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_450,SVar1,&local_470,&local_490);
  glu::VertexSource::VertexSource((VertexSource *)local_518,&local_450);
  pPVar6 = glu::ProgramSources::operator<<(&local_3f0,(ShaderSource *)local_518);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_4b0,SVar1,&local_4d0,&local_4f0);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_540,&local_4b0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_540);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar6);
  std::__cxx11::string::~string((string *)(local_540 + 8));
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)(local_518 + 8));
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  glu::ProgramSources::~ProgramSources(&local_3f0);
  std::__cxx11::string::~string((string *)&imageType);
  std::__cxx11::string::~string((string *)&texCoordType);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderUniformDecl);
  return this_00;
}

Assistant:

glu::ShaderProgram* ImageBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getImageTexCoordType());
	const std::string		imageType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_imageType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY) ? true : false;
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(rgba8, binding = " << m_bindings[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = imageLoad(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}